

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O1

bool __thiscall
cbtSingleSweepCallback::process(cbtSingleSweepCallback *this,cbtBroadphaseProxy *proxy)

{
  float fVar1;
  ConvexResultCallback *pCVar2;
  cbtCollisionObject *pcVar3;
  undefined8 uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  cbtCollisionObjectWrapper local_38;
  
  pCVar2 = this->m_resultCallback;
  fVar1 = pCVar2->m_closestHitFraction;
  auVar6 = ZEXT816(0) << 0x40;
  if ((fVar1 != 0.0) || (NAN(fVar1))) {
    pcVar3 = (cbtCollisionObject *)proxy->m_clientObject;
    iVar5 = (*pCVar2->_vptr_ConvexResultCallback[2])(pCVar2,pcVar3->m_broadphaseHandle);
    auVar6 = ZEXT816(0) << 0x40;
    if ((char)iVar5 != '\0') {
      local_38.m_shape = pcVar3->m_collisionShape;
      local_38.m_parent = (cbtCollisionObjectWrapper *)0x0;
      local_38.m_worldTransform = &pcVar3->m_worldTransform;
      local_38.m_partId = -1;
      local_38.m_index = -1;
      local_38.m_collisionObject = pcVar3;
      cbtCollisionWorld::objectQuerySingleInternal
                (this->m_castShape,&this->m_convexFromTrans,&this->m_convexToTrans,&local_38,
                 this->m_resultCallback,this->m_allowedCcdPenetration);
      auVar6 = ZEXT816(0) << 0x40;
    }
  }
  uVar4 = vcmpss_avx512f(ZEXT416((uint)fVar1),auVar6,4);
  return (bool)((byte)uVar4 & 1);
}

Assistant:

virtual bool process(const cbtBroadphaseProxy* proxy)
	{
		///terminate further convex sweep tests, once the closestHitFraction reached zero
		if (m_resultCallback.m_closestHitFraction == cbtScalar(0.f))
			return false;

		cbtCollisionObject* collisionObject = (cbtCollisionObject*)proxy->m_clientObject;

		//only perform raycast if filterMask matches
		if (m_resultCallback.needsCollision(collisionObject->getBroadphaseHandle()))
		{
			//RigidcollisionObject* collisionObject = ctrl->GetRigidcollisionObject();
			m_world->objectQuerySingle(m_castShape, m_convexFromTrans, m_convexToTrans,
									   collisionObject,
									   collisionObject->getCollisionShape(),
									   collisionObject->getWorldTransform(),
									   m_resultCallback,
									   m_allowedCcdPenetration);
		}

		return true;
	}